

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsReadOnlyPointerShaders(Instruction *this)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  IRContext *pIVar4;
  DefUseManager *this_00;
  DecorationManager *this_01;
  anon_class_8_1_00204016 local_50;
  function<void_(const_spvtools::opt::Instruction_&)> local_48;
  bool local_25;
  uint32_t local_24;
  bool is_nonwritable;
  Instruction *pIStack_20;
  StorageClass storage_class;
  Instruction *type_def;
  Instruction *this_local;
  
  type_def = this;
  uVar2 = type_id(this);
  if (uVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pIVar4 = context(this);
    this_00 = IRContext::get_def_use_mgr(pIVar4);
    uVar2 = type_id(this);
    pIStack_20 = analysis::DefUseManager::GetDef(this_00,uVar2);
    OVar3 = opcode(pIStack_20);
    if (OVar3 == OpTypePointer) {
      local_24 = GetSingleWordInOperand(pIStack_20,0);
      switch(local_24) {
      case 0:
        bVar1 = IsVulkanStorageImage(pIStack_20);
        if ((!bVar1) && (bVar1 = IsVulkanStorageTexelBuffer(pIStack_20), !bVar1)) {
          return true;
        }
        break;
      case 1:
      case 9:
        return true;
      case 2:
        bVar1 = IsVulkanStorageBuffer(pIStack_20);
        if (!bVar1) {
          return true;
        }
        break;
      default:
      }
      local_25 = false;
      pIVar4 = context(this);
      this_01 = IRContext::get_decoration_mgr(pIVar4);
      uVar2 = result_id(this);
      local_50.is_nonwritable = &local_25;
      std::function<void(spvtools::opt::Instruction_const&)>::
      function<spvtools::opt::Instruction::IsReadOnlyPointerShaders()const::__0,void>
                ((function<void(spvtools::opt::Instruction_const&)> *)&local_48,&local_50);
      analysis::DecorationManager::ForEachDecoration(this_01,uVar2,0x18,&local_48);
      std::function<void_(const_spvtools::opt::Instruction_&)>::~function(&local_48);
      this_local._7_1_ = (bool)(local_25 & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsReadOnlyPointerShaders() const {
  if (type_id() == 0) {
    return false;
  }

  Instruction* type_def = context()->get_def_use_mgr()->GetDef(type_id());
  if (type_def->opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class = spv::StorageClass(
      type_def->GetSingleWordInOperand(kPointerTypeStorageClassIndex));

  switch (storage_class) {
    case spv::StorageClass::UniformConstant:
      if (!type_def->IsVulkanStorageImage() &&
          !type_def->IsVulkanStorageTexelBuffer()) {
        return true;
      }
      break;
    case spv::StorageClass::Uniform:
      if (!type_def->IsVulkanStorageBuffer()) {
        return true;
      }
      break;
    case spv::StorageClass::PushConstant:
    case spv::StorageClass::Input:
      return true;
    default:
      break;
  }

  bool is_nonwritable = false;
  context()->get_decoration_mgr()->ForEachDecoration(
      result_id(), uint32_t(spv::Decoration::NonWritable),
      [&is_nonwritable](const Instruction&) { is_nonwritable = true; });
  return is_nonwritable;
}